

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int stagept)

{
  char *pcVar1;
  ostringstream os;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  if ((int)this == 1) {
    pcVar1 = 
    "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);"
    ;
  }
  else {
    if ((int)this != 0) goto LAB_00a0d1af;
    pcVar1 = "\nvoid main() {\n  gl_Position = vec4(0,0,0,1);";
  }
  std::operator<<(&oStack_188,pcVar1);
LAB_00a0d1af:
  std::operator<<(&oStack_188,"\n}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildShaderPT(int stagept)
	{
		std::ostringstream os;
		if (stagept == vertex)
		{
			os << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);";
		}
		if (stagept == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
					 "  o_color = vec4(0.0, 1.0, 0.0, 1.0);";
		}
		os << NL "}";
		return os.str();
	}